

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  bool bVar2;
  fpclass_type fVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_01;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  cpp_dec_float<50U,_int,_void> local_2d8;
  int *local_298;
  int32_t local_290;
  int local_28c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_280;
  int *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_a8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_a8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_a8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_a8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  vSolveLright2(this,rhs,ridx,&rn,&local_68,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),&local_a8);
  local_298 = idx;
  local_288 = vec;
  local_280 = this;
  local_270 = eps;
  if (eps2.m_backend.data._M_elems._32_8_ == 0) {
    if (rn < 1) {
      uVar15 = 0;
    }
    else {
      piVar4 = (this->row).perm;
      lVar16 = 0;
      uVar12 = 0;
      do {
        uVar15 = (uint)uVar12;
        iVar9 = ridx[lVar16];
        local_2d8.exp = rhs[iVar9].m_backend.exp;
        local_2d8.neg = rhs[iVar9].m_backend.neg;
        uVar5 = *(undefined8 *)(rhs[iVar9].m_backend.data._M_elems + 8);
        local_2d8.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_2d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_2d8.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar9].m_backend.data._M_elems;
        local_2d8.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar9].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar9].m_backend.data._M_elems + 4;
        local_2d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_2d8.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_2d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_2d8.fpclass = rhs[iVar9].m_backend.fpclass;
        local_2d8.prec_elem = rhs[iVar9].m_backend.prec_elem;
        local_228.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_228.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_228.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_228.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_228.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_228.exp = (eps->m_backend).exp;
        local_228.neg = (eps->m_backend).neg;
        local_228.fpclass = (eps->m_backend).fpclass;
        local_228.prec_elem = (eps->m_backend).prec_elem;
        if ((local_2d8.neg == true) &&
           (local_2d8.data._M_elems[0] != 0 || local_2d8.fpclass != cpp_dec_float_finite)) {
          local_2d8.neg = false;
        }
        if ((local_228.fpclass == cpp_dec_float_NaN || local_2d8.fpclass == cpp_dec_float_NaN) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_2d8,&local_228), iVar8 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[iVar9].m_backend,0);
        }
        else {
          iVar9 = piVar4[iVar9];
          uVar11 = uVar15;
          if (0 < (int)uVar15) {
            do {
              uVar13 = (uint)uVar12 - 1;
              uVar10 = uVar13 >> 1;
              uVar11 = (uint)uVar12;
              if (iVar9 <= ridx[uVar10]) break;
              ridx[uVar12] = ridx[uVar10];
              uVar12 = (ulong)uVar10;
              uVar11 = uVar10;
            } while (1 < uVar13);
          }
          uVar12 = (ulong)(uVar15 + 1);
          ridx[(int)uVar11] = iVar9;
        }
        lVar16 = lVar16 + 1;
        uVar15 = (int)uVar12;
      } while (lVar16 < rn);
    }
  }
  else {
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    if (rn < 1) {
      uVar15 = 0;
    }
    else {
      local_278 = (int *)eps2.m_backend._48_8_;
      piVar4 = (this->row).perm;
      lVar16 = 0;
      uVar15 = 0;
      do {
        iVar9 = ridx[lVar16];
        lVar14 = (long)iVar9;
        lVar17 = lVar14 * 0x38;
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(rhs[lVar14].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._0_16_ =
             *(undefined1 (*) [16])rhs[lVar14].m_backend.data._M_elems;
        result.m_backend.data._M_elems._16_16_ =
             *(undefined1 (*) [16])(rhs[lVar14].m_backend.data._M_elems + 4);
        local_2d8.exp = rhs[lVar14].m_backend.exp;
        bVar2 = rhs[lVar14].m_backend.neg;
        fVar3 = rhs[lVar14].m_backend.fpclass;
        local_2d8.prec_elem = rhs[lVar14].m_backend.prec_elem;
        uVar5 = *(undefined8 *)(rhs[lVar14].m_backend.data._M_elems + 8);
        local_2d8.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_2d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_2d8.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar14].m_backend.data._M_elems;
        local_2d8.data._M_elems._8_8_ = *(undefined8 *)(rhs[lVar14].m_backend.data._M_elems + 2);
        puVar1 = rhs[lVar14].m_backend.data._M_elems + 4;
        local_2d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_2d8.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_2d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_1e8.data._M_elems._0_8_ = *(undefined8 *)(local_270->m_backend).data._M_elems;
        local_1e8.data._M_elems._8_8_ = *(undefined8 *)((local_270->m_backend).data._M_elems + 2);
        local_1e8.data._M_elems._16_8_ = *(undefined8 *)((local_270->m_backend).data._M_elems + 4);
        local_1e8.data._M_elems._24_8_ = *(undefined8 *)((local_270->m_backend).data._M_elems + 6);
        local_1e8.data._M_elems._32_8_ = *(undefined8 *)((local_270->m_backend).data._M_elems + 8);
        local_1e8.exp = (local_270->m_backend).exp;
        local_1e8.neg = (local_270->m_backend).neg;
        local_1e8.fpclass = (local_270->m_backend).fpclass;
        local_1e8.prec_elem = (local_270->m_backend).prec_elem;
        local_2d8.fpclass = fVar3;
        local_2d8.neg = bVar2;
        if ((bVar2 == true) && (local_2d8.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          local_2d8.neg = false;
        }
        if ((local_1e8.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) ||
           (local_290 = local_2d8.prec_elem, local_28c = local_2d8.exp,
           iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_2d8,&local_1e8), iVar8 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[lVar14].m_backend,0);
        }
        else {
          *local_278 = iVar9;
          iVar9 = piVar4[lVar14];
          uVar11 = uVar15;
          if (0 < (int)uVar15) {
            do {
              uVar10 = uVar11 - 1;
              uVar13 = uVar10 >> 1;
              if (iVar9 <= ridx[uVar13]) break;
              ridx[uVar11] = ridx[uVar13];
              uVar11 = uVar13;
            } while (1 < uVar10);
          }
          local_278 = local_278 + 1;
          uVar15 = uVar15 + 1;
          ridx[(int)uVar11] = iVar9;
          *(undefined8 *)(eps2.m_backend.data._M_elems._32_8_ + 0x20 + lVar17) =
               result.m_backend.data._M_elems._32_8_;
          puVar1 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + 0x10 + lVar17);
          *(undefined8 *)puVar1 = result.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = result.m_backend.data._M_elems._24_8_;
          *(undefined8 *)(eps2.m_backend.data._M_elems._32_8_ + lVar17) =
               result.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._32_8_ + lVar17) + 2) =
               result.m_backend.data._M_elems._8_8_;
          *(int *)(eps2.m_backend.data._M_elems._32_8_ + 0x28 + lVar17) = local_28c;
          *(bool *)(eps2.m_backend.data._M_elems._32_8_ + 0x2c + lVar17) = bVar2;
          *(fpclass_type *)(eps2.m_backend.data._M_elems._32_8_ + 0x30 + lVar17) = fVar3;
          *(int32_t *)(eps2.m_backend.data._M_elems._32_8_ + 0x34 + lVar17) = local_290;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < rn);
    }
    *(uint *)eps2.m_backend._40_8_ = uVar15;
  }
  rn = uVar15;
  uVar5 = eps2.m_backend.data._M_elems._0_8_;
  if ((double)local_280->thedim * 0.2 < (double)(int)eps2.m_backend.data._M_elems[6]) {
    *(int *)eps2.m_backend.data._M_elems._16_8_ = local_280->thedim + -1;
    uVar15 = eps2.m_backend.data._M_elems[6];
  }
  else {
    local_2d8.fpclass = cpp_dec_float_finite;
    local_2d8.prec_elem = 10;
    local_2d8.data._M_elems[0] = 0;
    local_2d8.data._M_elems[1] = 0;
    local_2d8.data._M_elems[2] = 0;
    local_2d8.data._M_elems[3] = 0;
    local_2d8.data._M_elems[4] = 0;
    local_2d8.data._M_elems[5] = 0;
    local_2d8.data._M_elems._24_5_ = 0;
    local_2d8.data._M_elems[7]._1_3_ = 0;
    local_2d8.data._M_elems._32_5_ = 0;
    local_2d8.data._M_elems[9]._1_3_ = 0;
    local_2d8.exp = 0;
    local_2d8.neg = false;
    if ((int)eps2.m_backend.data._M_elems[6] < 1) {
      uVar15 = 0;
    }
    else {
      piVar4 = (local_280->row).perm;
      lVar16 = 0;
      uVar12 = 0;
      do {
        uVar15 = (uint)uVar12;
        lVar14 = (long)*(int *)(eps2.m_backend.data._M_elems._16_8_ + lVar16 * 4);
        lVar17 = lVar14 * 0x38;
        uVar6 = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x20 + lVar17);
        local_2d8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_2d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_2d8.data._M_elems._0_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + lVar17)
        ;
        local_2d8.data._M_elems._8_8_ =
             *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._8_8_ + lVar17) + 2);
        puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x10 + lVar17);
        local_2d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar6 = *(undefined8 *)(puVar1 + 2);
        local_2d8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_2d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_2d8.exp = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x28 + lVar17);
        local_2d8.neg = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x2c + lVar17);
        local_2d8._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x30 + lVar17);
        result.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar5 + 0x20);
        result.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])(uVar5 + 0x10);
        result.m_backend.exp = *(int *)(uVar5 + 0x28);
        result.m_backend.neg = *(bool *)(uVar5 + 0x2c);
        result.m_backend._48_8_ = *(undefined8 *)(uVar5 + 0x30);
        result.m_backend.data._M_elems[0] = (uint)*(undefined8 *)uVar5;
        if (result.m_backend.data._M_elems[0] != 0 ||
            result.m_backend.fpclass != cpp_dec_float_finite) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])uVar5;
        uVar11 = uVar15;
        if ((result.m_backend.fpclass == cpp_dec_float_NaN || local_2d8.fpclass == cpp_dec_float_NaN
            ) || (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_2d8,&result.m_backend), -1 < iVar9)) {
          if (((local_2d8.fpclass != cpp_dec_float_NaN) && (*(int *)(uVar5 + 0x30) != 2)) &&
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_2d8,(cpp_dec_float<50U,_int,_void> *)uVar5), 0 < iVar9)) {
            iVar9 = piVar4[lVar14];
            if (0 < (int)uVar15) {
              do {
                uVar13 = (uint)uVar12 - 1;
                uVar10 = uVar13 >> 1;
                iVar8 = *(int *)(eps2.m_backend.data._M_elems._16_8_ + (ulong)uVar10 * 4);
                uVar11 = (uint)uVar12;
                if (iVar9 <= iVar8) break;
                *(int *)(eps2.m_backend.data._M_elems._16_8_ + uVar12 * 4) = iVar8;
                uVar12 = (ulong)uVar10;
                uVar11 = uVar10;
              } while (1 < uVar13);
            }
            goto LAB_002ad680;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)(lVar17 + eps2.m_backend.data._M_elems._8_8_),
                     0);
        }
        else {
          iVar9 = piVar4[lVar14];
          if (0 < (int)uVar15) {
            do {
              uVar13 = (uint)uVar12 - 1;
              uVar10 = uVar13 >> 1;
              iVar8 = *(int *)(eps2.m_backend.data._M_elems._16_8_ + (ulong)uVar10 * 4);
              uVar11 = (uint)uVar12;
              if (iVar9 <= iVar8) break;
              *(int *)(eps2.m_backend.data._M_elems._16_8_ + uVar12 * 4) = iVar8;
              uVar12 = (ulong)uVar10;
              uVar11 = uVar10;
            } while (1 < uVar13);
          }
LAB_002ad680:
          uVar12 = (ulong)(uVar15 + 1);
          *(int *)(eps2.m_backend.data._M_elems._16_8_ + (long)(int)uVar11 * 4) = iVar9;
        }
        lVar16 = lVar16 + 1;
        uVar15 = (uint)uVar12;
      } while (lVar16 < (int)eps2.m_backend.data._M_elems[6]);
    }
  }
  eps2.m_backend.data._M_elems[6] = uVar15;
  pnVar7 = local_270;
  this_00 = local_280;
  vec_01 = local_288;
  uVar6 = eps2.m_backend.data._M_elems._16_8_;
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_270->m_backend).data._M_elems;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_270->m_backend).data._M_elems + 2)
  ;
  local_e8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((local_270->m_backend).data._M_elems + 4);
  local_e8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((local_270->m_backend).data._M_elems + 6);
  local_e8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_270->m_backend).data._M_elems + 8);
  local_e8.m_backend.exp = (local_270->m_backend).exp;
  local_e8.m_backend.neg = (local_270->m_backend).neg;
  local_e8.m_backend.fpclass = (local_270->m_backend).fpclass;
  local_e8.m_backend.prec_elem = (local_270->m_backend).prec_elem;
  rn = vSolveUright(local_280,local_288,local_298,rhs,ridx,rn,&local_e8);
  vec_00 = vec2;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar5;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar5 + 8);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar5 + 0x10);
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar5 + 0x18);
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar5 + 0x20);
  local_128.m_backend.exp = *(int *)(uVar5 + 0x28);
  local_128.m_backend.neg = *(bool *)(uVar5 + 0x2c);
  local_128.m_backend._48_8_ = *(undefined8 *)(uVar5 + 0x30);
  vSolveUrightNoNZ(this_00,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,(int *)uVar6,
                   eps2.m_backend.data._M_elems[6],&local_128);
  if ((this_00->l).updateType == 0) {
    local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar7->m_backend).data._M_elems;
    local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar7->m_backend).data._M_elems + 2)
    ;
    local_168.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 4);
    local_168.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 6);
    local_168.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 8);
    local_168.m_backend.exp = (pnVar7->m_backend).exp;
    local_168.m_backend.neg = (pnVar7->m_backend).neg;
    local_168.m_backend.fpclass = (pnVar7->m_backend).fpclass;
    local_168.m_backend.prec_elem = (pnVar7->m_backend).prec_elem;
    rn = vSolveUpdateRight(this_00,vec_01,local_298,rn,&local_168);
    local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar5;
    local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar5 + 8);
    local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar5 + 0x10);
    local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar5 + 0x18);
    local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar5 + 0x20);
    local_1a8.m_backend.exp = *(int *)(uVar5 + 0x28);
    local_1a8.m_backend.neg = *(bool *)(uVar5 + 0x2c);
    local_1a8.m_backend._48_8_ = *(undefined8 *)(uVar5 + 0x30);
    vSolveUpdateRightNoNZ(this_00,vec_00,&local_1a8);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}